

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

ssize_t __thiscall
fmt::v7::detail::
arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>::
write(arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      *this,int __fd,void *__buf,size_t __n)

{
  buffer<char> *pbVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  buffer<char> *buf;
  
  pbVar1 = (this->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  sVar2 = pbVar1->size_;
  uVar3 = pbVar1->capacity_;
  uVar4 = sVar2 + 1;
  if (uVar3 < uVar4) {
    (**pbVar1->_vptr_buffer)(pbVar1);
    sVar2 = pbVar1->size_;
    uVar3 = pbVar1->capacity_;
    uVar4 = sVar2 + 1;
  }
  if (uVar3 < uVar4) {
    (**pbVar1->_vptr_buffer)(pbVar1);
    sVar2 = pbVar1->size_;
    uVar4 = sVar2 + 1;
  }
  pbVar1->size_ = uVar4;
  pbVar1->ptr_[sVar2] = (char)__fd;
  return sVar2;
}

Assistant:

void write(char value) {
    auto&& it = reserve(1);
    *it++ = value;
  }